

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O1

void rand_bytes(byte *pb,size_t cb)

{
  mbedtls_entropy_context entropy;
  mbedtls_ctr_drbg_context ctrDrbg;
  mbedtls_entropy_context local_1c0;
  mbedtls_ctr_drbg_context local_178;
  
  mbedtls_entropy_init(&local_1c0);
  mbedtls_ctr_drbg_init(&local_178);
  mbedtls_ctr_drbg_seed(&local_178,mbedtls_entropy_func,&local_1c0,nonce_pers_pr,0x10);
  mbedtls_ctr_drbg_random(&local_178,pb,cb);
  mbedtls_ctr_drbg_free(&local_178);
  mbedtls_entropy_free(&local_1c0);
  return;
}

Assistant:

void rand_bytes(byte* pb, size_t cb) {
    mbedtls_entropy_context  entropy;
	mbedtls_ctr_drbg_context ctrDrbg;

	mbedtls_entropy_init(&entropy);
    mbedtls_ctr_drbg_init(&ctrDrbg);
    mbedtls_ctr_drbg_seed(&ctrDrbg, mbedtls_entropy_func, &entropy, nonce_pers_pr, sizeof(nonce_pers_pr));
    
	mbedtls_ctr_drbg_random(&ctrDrbg, pb, cb);

	mbedtls_ctr_drbg_free(&ctrDrbg);
    mbedtls_entropy_free(&entropy);
}